

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O3

void Abc_NtkDfsReverse_rec(Abc_Obj_t *pNode,Vec_Ptr_t *vNodes)

{
  int iVar1;
  int iVar2;
  Abc_Ntk_t *pAVar3;
  Abc_Ntk_t *pAVar4;
  uint uVar5;
  void **ppvVar6;
  int in_EDX;
  int Fill;
  long lVar7;
  
  if ((*(uint *)&pNode->field_0x14 & 0xf) == 6) {
    __assert_fail("!Abc_ObjIsNet(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcDfs.c"
                  ,0xbf,"void Abc_NtkDfsReverse_rec(Abc_Obj_t *, Vec_Ptr_t *)");
  }
  pAVar3 = pNode->pNtk;
  iVar1 = pNode->Id;
  Vec_IntFillExtra(&pAVar3->vTravIds,iVar1 + 1,in_EDX);
  if ((-1 < (long)iVar1) && (iVar1 < (pAVar3->vTravIds).nSize)) {
    pAVar4 = pNode->pNtk;
    iVar2 = pAVar4->nTravIds;
    if ((pAVar3->vTravIds).pArray[iVar1] != iVar2) {
      iVar1 = pNode->Id;
      Vec_IntFillExtra(&pAVar4->vTravIds,iVar1 + 1,Fill);
      if (((long)iVar1 < 0) || ((pAVar4->vTravIds).nSize <= iVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      (pAVar4->vTravIds).pArray[iVar1] = iVar2;
      uVar5 = *(uint *)&pNode->field_0x14 & 0xf;
      if (uVar5 - 5 < 0xfffffffe) {
        if (uVar5 != 7) {
          __assert_fail("Abc_ObjIsNode( pNode )",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcDfs.c"
                        ,200,"void Abc_NtkDfsReverse_rec(Abc_Obj_t *, Vec_Ptr_t *)");
        }
        if (pNode->pNtk->ntkType == ABC_NTK_NETLIST) {
          pNode = (Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray];
        }
        if (0 < (pNode->vFanouts).nSize) {
          lVar7 = 0;
          do {
            Abc_NtkDfsReverse_rec
                      ((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanouts).pArray[lVar7]],
                       vNodes);
            lVar7 = lVar7 + 1;
          } while (lVar7 < (pNode->vFanouts).nSize);
        }
        uVar5 = vNodes->nSize;
        if (uVar5 == vNodes->nCap) {
          if ((int)uVar5 < 0x10) {
            if (vNodes->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc(0x80);
            }
            else {
              ppvVar6 = (void **)realloc(vNodes->pArray,0x80);
            }
            vNodes->pArray = ppvVar6;
            vNodes->nCap = 0x10;
          }
          else {
            if (vNodes->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc((ulong)uVar5 << 4);
            }
            else {
              ppvVar6 = (void **)realloc(vNodes->pArray,(ulong)uVar5 << 4);
            }
            vNodes->pArray = ppvVar6;
            vNodes->nCap = uVar5 * 2;
          }
        }
        else {
          ppvVar6 = vNodes->pArray;
        }
        iVar1 = vNodes->nSize;
        vNodes->nSize = iVar1 + 1;
        ppvVar6[iVar1] = pNode;
      }
    }
    return;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Abc_NtkDfsReverse_rec( Abc_Obj_t * pNode, Vec_Ptr_t * vNodes )
{
    Abc_Obj_t * pFanout;
    int i;
    assert( !Abc_ObjIsNet(pNode) );
    // if this node is already visited, skip
    if ( Abc_NodeIsTravIdCurrent( pNode ) )
        return;
    // mark the node as visited
    Abc_NodeSetTravIdCurrent( pNode );
    // skip the CI
    if ( Abc_ObjIsCo(pNode) )
        return;
    assert( Abc_ObjIsNode( pNode ) );
    // visit the transitive fanin of the node
    pNode = Abc_ObjFanout0Ntk(pNode);
    Abc_ObjForEachFanout( pNode, pFanout, i )
        Abc_NtkDfsReverse_rec( pFanout, vNodes );
    // add the node after the fanins have been added
    Vec_PtrPush( vNodes, pNode );
}